

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ReadFileResult __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetInherit(ConfigurePreset *this,Preset *parentPreset)

{
  bool bVar1;
  size_t *this_00;
  reference __x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
  *v;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  *__range1;
  ConfigurePreset *parent;
  ConfigurePreset *preset;
  Preset *parentPreset_local;
  ConfigurePreset *this_local;
  
  anon_unknown.dwarf_3e3c5b::InheritString(&this->Generator,(string *)(parentPreset + 1));
  anon_unknown.dwarf_3e3c5b::InheritString
            (&this->Architecture,(string *)((long)&parentPreset[1].Name.field_2 + 8));
  anon_unknown.dwarf_3e3c5b::InheritString(&this->Toolset,(string *)&parentPreset[1].OriginFile);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ArchitectureStrategy);
  if (!bVar1) {
    (this->ArchitectureStrategy).
    super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
         *(_Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> *)
          &parentPreset[1].Hidden;
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ToolsetStrategy);
  if (!bVar1) {
    (this->ToolsetStrategy).
    super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
         *(_Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> *)
          ((long)&parentPreset[1].DisplayName.field_2 + 8);
  }
  anon_unknown.dwarf_3e3c5b::InheritString
            (&this->BinaryDir,(string *)&parentPreset[1].ConditionEvaluator);
  anon_unknown.dwarf_3e3c5b::InheritString
            (&this->InstallDir,
             (string *)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header);
  anon_unknown.dwarf_3e3c5b::InheritString(&this->ToolchainFile,&parentPreset[1].Description);
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->WarnDev,(optional<bool> *)&parentPreset[2].Inherits);
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->ErrorDev,
             (optional<bool> *)
             ((long)&parentPreset[2].Inherits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2));
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->WarnDeprecated,
             (optional<bool> *)
             ((long)&parentPreset[2].Inherits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4));
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->ErrorDeprecated,
             (optional<bool> *)
             ((long)&parentPreset[2].Inherits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 6));
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->WarnUninitialized,
             (optional<bool> *)
             &parentPreset[2].Inherits.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->WarnUnusedCli,
             (optional<bool> *)
             ((long)&parentPreset[2].Inherits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 2));
  anon_unknown.dwarf_3e3c5b::InheritOptionalValue<bool>
            (&this->WarnSystemVars,
             (optional<bool> *)
             ((long)&parentPreset[2].Inherits.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4));
  this_00 = &parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
                    *)this_00);
  v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
                *)this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&v);
    if (!bVar1) break;
    __x = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
          ::operator*(&__end1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
    ::insert(&this->CacheVariables,__x);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
    ::operator++(&__end1);
  }
  return READ_OK;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::ConfigurePreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const ConfigurePreset& parent =
    static_cast<const ConfigurePreset&>(parentPreset);
  InheritString(preset.Generator, parent.Generator);
  InheritString(preset.Architecture, parent.Architecture);
  InheritString(preset.Toolset, parent.Toolset);
  if (!preset.ArchitectureStrategy) {
    preset.ArchitectureStrategy = parent.ArchitectureStrategy;
  }
  if (!preset.ToolsetStrategy) {
    preset.ToolsetStrategy = parent.ToolsetStrategy;
  }
  InheritString(preset.BinaryDir, parent.BinaryDir);
  InheritString(preset.InstallDir, parent.InstallDir);
  InheritString(preset.ToolchainFile, parent.ToolchainFile);
  InheritOptionalValue(preset.WarnDev, parent.WarnDev);
  InheritOptionalValue(preset.ErrorDev, parent.ErrorDev);
  InheritOptionalValue(preset.WarnDeprecated, parent.WarnDeprecated);
  InheritOptionalValue(preset.ErrorDeprecated, parent.ErrorDeprecated);
  InheritOptionalValue(preset.WarnUninitialized, parent.WarnUninitialized);
  InheritOptionalValue(preset.WarnUnusedCli, parent.WarnUnusedCli);
  InheritOptionalValue(preset.WarnSystemVars, parent.WarnSystemVars);

  for (auto const& v : parent.CacheVariables) {
    preset.CacheVariables.insert(v);
  }

  return ReadFileResult::READ_OK;
}